

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pizza_cutter.cpp
# Opt level: O2

ostream * operator<<(ostream *os,pizza_slice ps)

{
  ostream *poVar1;
  
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)os,ps.row1);
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,ps.col1);
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,ps.row2);
  poVar1 = std::operator<<(poVar1,' ');
  std::ostream::operator<<((ostream *)poVar1,ps.col2);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, pizza_slice ps) noexcept
{
    os << ps.row1 << ' ' << ps.col1 << ' ' << ps.row2 << ' ' << ps.col2;
    return os;
}